

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall llvm::DWARFVerifier::verifyDebugInfoReferences(DWARFVerifier *this)

{
  bool bVar1;
  reference __p;
  raw_ostream *prVar2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  reference puVar3;
  DWARFDie DVar4;
  DWARFDie local_d8;
  uint64_t local_c8;
  unsigned_long Offset;
  iterator __end2;
  iterator __begin2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  undefined4 local_90;
  DWARFDie local_80;
  pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_70;
  pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_38;
  pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *Pair;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *__range1;
  uint NumErrors;
  DWARFVerifier *this_local;
  
  raw_ostream::operator<<(this->OS,"Verifying .debug_info references...\n");
  __range1._4_4_ = 0;
  __end1 = std::
           map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(&this->ReferenceToDIEOffsets);
  Pair = (pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
          *)std::
            map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::end(&this->ReferenceToDIEOffsets);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&Pair);
    if (!bVar1) break;
    __p = std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::operator*(&__end1);
    std::
    pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::
    pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
              (&local_70,__p);
    local_38 = &local_70;
    DVar4 = DWARFContext::getDIEForOffset(this->DCtx,local_70.first);
    local_80 = DVar4;
    bVar1 = DWARFDie::operator_cast_to_bool(&local_80);
    if (bVar1) {
      local_90 = 3;
    }
    else {
      __range1._4_4_ = __range1._4_4_ + 1;
      prVar2 = error(this);
      prVar2 = raw_ostream::operator<<(prVar2,"invalid DIE reference ");
      format<unsigned_long>((format_object<unsigned_long> *)&__range2,"0x%08lx",&local_38->first);
      prVar2 = raw_ostream::operator<<(prVar2,(format_object_base *)&__range2);
      raw_ostream::operator<<(prVar2,". Offset is in between DIEs:\n");
      this_00 = &local_38->second;
      __end2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin(this_00);
      Offset = (unsigned_long)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end(this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end2,(_Self *)&Offset);
        if (!bVar1) break;
        puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end2);
        local_c8 = *puVar3;
        DVar4 = DWARFContext::getDIEForOffset(this->DCtx,local_c8);
        local_d8 = DVar4;
        prVar2 = dump(this,&local_d8,0);
        raw_ostream::operator<<(prVar2,'\n');
        std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end2);
      }
      raw_ostream::operator<<(this->OS,"\n");
      local_90 = 0;
    }
    std::
    pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::~pair(&local_70);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoReferences() {
  // Take all references and make sure they point to an actual DIE by
  // getting the DIE by offset and emitting an error
  OS << "Verifying .debug_info references...\n";
  unsigned NumErrors = 0;
  for (const std::pair<uint64_t, std::set<uint64_t>> &Pair :
       ReferenceToDIEOffsets) {
    if (DCtx.getDIEForOffset(Pair.first))
      continue;
    ++NumErrors;
    error() << "invalid DIE reference " << format("0x%08" PRIx64, Pair.first)
            << ". Offset is in between DIEs:\n";
    for (auto Offset : Pair.second)
      dump(DCtx.getDIEForOffset(Offset)) << '\n';
    OS << "\n";
  }
  return NumErrors;
}